

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O1

void __thiscall
deqp::QuadGrid::QuadGrid
          (QuadGrid *this,int gridSize,int width,int height,Vec4 *constCoords,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
          *userAttribTransforms,
          vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_> *textures)

{
  uint uVar1;
  pointer pVVar2;
  pointer puVar3;
  int iVar4;
  unsigned_short uVar5;
  int i;
  long lVar6;
  int iVar7;
  long lVar8;
  unsigned_short uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  pointer pMVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  float fx;
  float fVar19;
  float fVar20;
  float fy;
  float fVar21;
  float fVar22;
  float v;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 viewportScale;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_68;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_60;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *local_58;
  vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_> *local_50;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *local_48;
  float local_40 [4];
  
  this->m_gridSize = gridSize;
  uVar1 = gridSize + 1;
  this->m_numVertices = uVar1 * uVar1;
  this->m_numTriangles = gridSize * gridSize * 2;
  lVar6 = 0;
  do {
    (this->m_constCoords).m_data[lVar6] = constCoords->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  local_48 = &this->m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (local_48,userAttribTransforms);
  local_50 = &this->m_textures;
  std::vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::vector
            (local_50,textures);
  local_68 = &this->m_screenPos;
  local_58 = &this->m_coords;
  local_60 = &this->m_unitCoords;
  memset(local_68,0,0xd8);
  (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40[0] = (float)width;
  (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40[1] = (float)height;
  local_40[2] = 0.0;
  local_40[3] = 0.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_positions,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (local_58,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (local_60,(long)this->m_numVertices);
  std::vector<float,_std::allocator<float>_>::resize(&this->m_attribOne,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (local_68,(long)this->m_numVertices);
  lVar6 = 0;
  do {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               ((long)&this->m_userAttribs[0].
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar6),(long)this->m_numVertices)
    ;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x60);
  if ((uint)gridSize < 0x7fffffff) {
    iVar10 = 0;
    do {
      fVar20 = (float)iVar10 / (float)gridSize;
      fVar21 = fVar20 + fVar20 + -1.0;
      uVar11 = 0;
      do {
        fVar22 = (float)(int)uVar11 / (float)gridSize;
        fVar19 = fVar22 + fVar22 + -1.0;
        iVar7 = iVar10 * uVar1 + (int)uVar11;
        pVVar2 = (this->m_positions).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2[iVar7].m_data[0] = fVar19;
        pVVar2[iVar7].m_data[1] = fVar21;
        pVVar2[iVar7].m_data[2] = 0.0;
        pVVar2[iVar7].m_data[3] = 1.0;
        (this->m_attribOne).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[iVar7] = 1.0;
        local_88 = CONCAT44(fVar20,fVar22);
        uStack_80 = 0x3f80000000000000;
        local_78 = 0;
        uStack_70 = 0;
        lVar6 = 0;
        do {
          *(float *)((long)&local_78 + lVar6 * 4) =
               *(float *)((long)&local_88 + lVar6 * 4) * local_40[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        pVVar2 = (this->m_screenPos).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar7;
        *(undefined8 *)pVVar2->m_data = local_78;
        *(undefined8 *)(pVVar2->m_data + 2) = uStack_70;
        pVVar2 = (this->m_coords).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2[iVar7].m_data[0] = fVar19;
        pVVar2[iVar7].m_data[1] = fVar21;
        pVVar2[iVar7].m_data[2] = fVar21 * 0.33 - fVar19;
        pVVar2[iVar7].m_data[3] = fVar19 * -0.275 + -fVar21;
        pVVar2 = (this->m_unitCoords).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar2[iVar7].m_data[0] = fVar22;
        pVVar2[iVar7].m_data[1] = fVar20;
        pVVar2[iVar7].m_data[2] = fVar22 * 0.33 + fVar20 * 0.5;
        pVVar2[iVar7].m_data[3] = fVar22 * 0.5 + fVar20 * 0.25;
        pMVar13 = (this->m_userAttribTransforms).
                  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)(this->m_userAttribTransforms).
                                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar13) >> 6
                     )) {
          lVar6 = 0;
          lVar16 = 0;
          do {
            local_78 = CONCAT44(fVar20,fVar22);
            uStack_70 = 0x3f80000000000000;
            local_88 = 0;
            uStack_80 = 0;
            lVar14 = (long)(pMVar13->m_data).m_data[0].m_data + lVar6;
            lVar17 = 0;
            do {
              fVar19 = 0.0;
              lVar8 = 0;
              do {
                fVar19 = fVar19 + *(float *)(lVar14 + lVar8 * 4) *
                                  *(float *)((long)&local_78 + lVar8);
                lVar8 = lVar8 + 4;
              } while (lVar8 != 0x10);
              *(float *)((long)&local_88 + lVar17 * 4) = fVar19;
              lVar17 = lVar17 + 1;
              lVar14 = lVar14 + 4;
            } while (lVar17 != 4);
            pVVar2 = this->m_userAttribs[lVar16].
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar7;
            *(undefined8 *)pVVar2->m_data = local_88;
            *(undefined8 *)((long)pVVar2->m_data + 8) = uStack_80;
            lVar16 = lVar16 + 1;
            pMVar13 = (this->m_userAttribTransforms).
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar6 = lVar6 + 0x40;
          } while (lVar16 < (int)((ulong)((long)(this->m_userAttribTransforms).
                                                super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pMVar13) >> 6));
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar1);
      bVar18 = iVar10 != gridSize;
      iVar10 = iVar10 + 1;
    } while (bVar18);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_indices,(long)(this->m_numTriangles * 3));
  if (0 < gridSize) {
    puVar3 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar10 = 0;
    iVar7 = 0;
    iVar12 = 0;
    do {
      lVar6 = 0;
      iVar15 = iVar10;
      do {
        iVar4 = (int)lVar6;
        uVar5 = (unsigned_short)iVar15;
        uVar9 = (short)gridSize + uVar5 + 1;
        puVar3[iVar7 + iVar4] = uVar9;
        puVar3[iVar7 + 1 + iVar4] = uVar5;
        iVar15 = iVar15 + 1;
        puVar3[iVar7 + 2 + iVar4] = (unsigned_short)iVar15;
        puVar3[iVar7 + 3 + iVar4] = uVar9;
        puVar3[iVar7 + 4 + iVar4] = (unsigned_short)iVar15;
        puVar3[iVar7 + iVar4 + 5] = (short)gridSize + 2 + uVar5;
        lVar6 = lVar6 + 6;
      } while ((ulong)(uint)gridSize * 6 != lVar6);
      iVar12 = iVar12 + 1;
      iVar7 = iVar7 + gridSize * 6;
      iVar10 = iVar10 + uVar1;
    } while (iVar12 != gridSize);
  }
  return;
}

Assistant:

QuadGrid::QuadGrid(int gridSize, int width, int height, const Vec4& constCoords,
				   const vector<Mat4>& userAttribTransforms, const vector<TextureBinding>& textures)
	: m_gridSize(gridSize)
	, m_numVertices((gridSize + 1) * (gridSize + 1))
	, m_numTriangles(gridSize * gridSize * 2)
	, m_constCoords(constCoords)
	, m_userAttribTransforms(userAttribTransforms)
	, m_textures(textures)
{
	Vec4 viewportScale = Vec4((float)width, (float)height, 0.0f, 0.0f);

	// Compute vertices.
	m_positions.resize(m_numVertices);
	m_coords.resize(m_numVertices);
	m_unitCoords.resize(m_numVertices);
	m_attribOne.resize(m_numVertices);
	m_screenPos.resize(m_numVertices);

	// User attributes.
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_userAttribs); i++)
		m_userAttribs[i].resize(m_numVertices);

	for (int y = 0; y < gridSize + 1; y++)
		for (int x = 0; x < gridSize + 1; x++)
		{
			float sx	 = static_cast<float>(x) / static_cast<float>(gridSize);
			float sy	 = static_cast<float>(y) / static_cast<float>(gridSize);
			float fx	 = 2.0f * sx - 1.0f;
			float fy	 = 2.0f * sy - 1.0f;
			int   vtxNdx = ((y * (gridSize + 1)) + x);

			m_positions[vtxNdx]  = Vec4(fx, fy, 0.0f, 1.0f);
			m_attribOne[vtxNdx]  = 1.0f;
			m_screenPos[vtxNdx]  = Vec4(sx, sy, 0.0f, 1.0f) * viewportScale;
			m_coords[vtxNdx]	 = getCoords(sx, sy);
			m_unitCoords[vtxNdx] = getUnitCoords(sx, sy);

			for (int attribNdx					 = 0; attribNdx < getNumUserAttribs(); attribNdx++)
				m_userAttribs[attribNdx][vtxNdx] = getUserAttrib(attribNdx, sx, sy);
		}

	// Compute indices.
	m_indices.resize(3 * m_numTriangles);
	for (int y = 0; y < gridSize; y++)
		for (int x = 0; x < gridSize; x++)
		{
			int stride = gridSize + 1;
			int v00	= (y * stride) + x;
			int v01	= (y * stride) + x + 1;
			int v10	= ((y + 1) * stride) + x;
			int v11	= ((y + 1) * stride) + x + 1;

			int baseNdx			   = ((y * gridSize) + x) * 6;
			m_indices[baseNdx + 0] = static_cast<deUint16>(v10);
			m_indices[baseNdx + 1] = static_cast<deUint16>(v00);
			m_indices[baseNdx + 2] = static_cast<deUint16>(v01);

			m_indices[baseNdx + 3] = static_cast<deUint16>(v10);
			m_indices[baseNdx + 4] = static_cast<deUint16>(v01);
			m_indices[baseNdx + 5] = static_cast<deUint16>(v11);
		}
}